

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManGetDangling(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  ulong uVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
    pGVar2 = Gia_ManObj(p,iVar4);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar2;
    *(ulong *)pGVar2 = uVar1 & 0xffffffffbfffffff;
    uVar3 = uVar1 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar1 < 0) {
      if ((int)uVar1 < 0 && (int)uVar3 != 0x1fffffff) goto LAB_0061a1c5;
    }
    else {
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
      uVar3 = (ulong)(*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
LAB_0061a1c5:
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
    }
  }
  p_00 = Vec_IntAlloc(100);
  for (iVar4 = 0; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
    pGVar2 = Gia_ManObj(p,iVar4);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar2 & 0xc0000000) == 0 && (~(uint)*(ulong *)pGVar2 & 0x1fffffff) != 0) {
      Vec_IntPush(p_00,iVar4);
    }
  }
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetDangling( Gia_Man_t * p )
{
    Vec_Int_t * vDangles;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    vDangles = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( p, pObj, i )
        if ( !pObj->fMark0 )
            Vec_IntPush( vDangles, i );
    Gia_ManCleanMark0( p );
    return vDangles;
}